

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O0

void __thiscall ipx::Iterate::ComputeComplementarity(Iterate *this)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  undefined8 *in_RDI;
  Int j_1;
  Int j;
  Int num_finite;
  Int n;
  Int m;
  double in_stack_ffffffffffffff68;
  Iterate *in_stack_ffffffffffffff70;
  double local_40;
  double local_38;
  int local_2c;
  double local_28;
  double local_20;
  int local_18;
  int local_14;
  int local_10;
  Int local_c;
  
  local_c = Model::rows((Model *)*in_RDI);
  local_10 = Model::cols((Model *)*in_RDI);
  in_RDI[0x1d] = 0;
  in_RDI[0x1f] = 0x7ff0000000000000;
  in_RDI[0x20] = 0;
  local_14 = 0;
  for (local_18 = 0; local_18 < local_10 + local_c; local_18 = local_18 + 1) {
    bVar2 = has_barrier_lb(in_stack_ffffffffffffff70,(Int)((ulong)in_stack_ffffffffffffff68 >> 0x20)
                          );
    if (bVar2) {
      pdVar3 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 3),(long)local_18);
      dVar1 = *pdVar3;
      pdVar3 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 9),(long)local_18);
      in_RDI[0x1d] = dVar1 * *pdVar3 + (double)in_RDI[0x1d];
      pdVar3 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 3),(long)local_18);
      dVar1 = *pdVar3;
      pdVar3 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 9),(long)local_18);
      local_20 = dVar1 * *pdVar3;
      pdVar3 = std::min<double>((double *)(in_RDI + 0x1f),&local_20);
      in_RDI[0x1f] = *pdVar3;
      pdVar3 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 3),(long)local_18);
      dVar1 = *pdVar3;
      pdVar3 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 9),(long)local_18);
      local_28 = dVar1 * *pdVar3;
      pdVar3 = std::max<double>((double *)(in_RDI + 0x20),&local_28);
      in_RDI[0x20] = *pdVar3;
      local_14 = local_14 + 1;
    }
  }
  for (local_2c = 0; local_2c < local_10 + local_c; local_2c = local_2c + 1) {
    bVar2 = has_barrier_ub(in_stack_ffffffffffffff70,(Int)((ulong)in_stack_ffffffffffffff68 >> 0x20)
                          );
    if (bVar2) {
      pdVar3 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 5),(long)local_2c);
      in_stack_ffffffffffffff68 = *pdVar3;
      pdVar3 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0xb),(long)local_2c);
      in_RDI[0x1d] = in_stack_ffffffffffffff68 * *pdVar3 + (double)in_RDI[0x1d];
      pdVar3 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 5),(long)local_2c);
      in_stack_ffffffffffffff70 = (Iterate *)*pdVar3;
      pdVar3 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0xb),(long)local_2c);
      local_38 = (double)in_stack_ffffffffffffff70 * *pdVar3;
      pdVar3 = std::min<double>((double *)(in_RDI + 0x1f),&local_38);
      in_RDI[0x1f] = *pdVar3;
      pdVar3 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 5),(long)local_2c);
      dVar1 = *pdVar3;
      pdVar3 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0xb),(long)local_2c);
      local_40 = dVar1 * *pdVar3;
      pdVar3 = std::max<double>((double *)(in_RDI + 0x20),&local_40);
      in_RDI[0x20] = *pdVar3;
      local_14 = local_14 + 1;
    }
  }
  if (local_14 < 1) {
    in_RDI[0x1f] = 0;
    in_RDI[0x1e] = 0;
  }
  else {
    in_RDI[0x1e] = (double)in_RDI[0x1d] / (double)local_14;
  }
  return;
}

Assistant:

void Iterate::ComputeComplementarity() const {
    const Int m = model_.rows();
    const Int n = model_.cols();

    complementarity_ = 0.0;
    mu_min_ = INFINITY;
    mu_max_ = 0.0;
    Int num_finite = 0;
    for (Int j = 0; j < n+m; j++) {
        if (has_barrier_lb(j)) {
            complementarity_ += xl_[j] * zl_[j];
            mu_min_ = std::min(mu_min_, xl_[j]*zl_[j]);
            mu_max_ = std::max(mu_max_, xl_[j]*zl_[j]);
            num_finite++;
        }
    }
    for (Int j = 0; j < n+m; j++) {
        if (has_barrier_ub(j)) {
            complementarity_ += xu_[j] * zu_[j];
            mu_min_ = std::min(mu_min_, xu_[j]*zu_[j]);
            mu_max_ = std::max(mu_max_, xu_[j]*zu_[j]);
            num_finite++;
        }
    }
    if (num_finite > 0)
        mu_ = complementarity_ / num_finite;
    else
        mu_ = mu_min_ = 0.0;
}